

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O1

Image * deqp::gls::fboc::details::makeImage
                  (GLenum bufType,ImageFormat format,GLsizei width,GLsizei height,
                  FboBuilder *builder)

{
  Image *pIVar1;
  Image *local_30;
  
  if (bufType == 0) {
    pIVar1 = (Image *)0x0;
  }
  else {
    if (bufType == 0x1702) {
      pIVar1 = (Image *)operator_new(0x20);
      pIVar1->width = 0;
      pIVar1->height = 0;
      pIVar1[1].super_Config._vptr_Config = (_func_int **)0x0;
      (pIVar1->super_Config)._vptr_Config = (_func_int **)0x0;
      (pIVar1->internalFormat).format = 0;
      (pIVar1->internalFormat).unsizedType = 0;
      *(undefined4 *)&pIVar1[1].super_Config._vptr_Config = 1;
      (pIVar1->super_Config)._vptr_Config = (_func_int **)&PTR__Config_021c1060;
    }
    else {
      pIVar1 = (Image *)operator_new(0x20);
      (pIVar1->internalFormat).format = 0;
      (pIVar1->internalFormat).unsizedType = 0;
      pIVar1->width = 0;
      pIVar1->height = 0;
      (pIVar1->super_Config)._vptr_Config = (_func_int **)&PTR__Config_0218fbf8;
      *(undefined4 *)&pIVar1[1].super_Config._vptr_Config = 0;
    }
    local_30 = pIVar1;
    std::
    _Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
    ::_M_insert_unique<deqp::gls::FboUtil::config::Config*>
              ((_Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
                *)&builder->m_configs,(Config **)&local_30);
    pIVar1->internalFormat = format;
    pIVar1->width = width;
    pIVar1->height = height;
  }
  return pIVar1;
}

Assistant:

Image* makeImage (GLenum bufType, ImageFormat format,
				  GLsizei width, GLsizei height, FboBuilder& builder)
{
	Image* image = DE_NULL;
	switch (bufType)
	{
		case GL_NONE:
			return DE_NULL;
		case GL_RENDERBUFFER:
			image = &builder.makeConfig<Renderbuffer>();
			break;
		case GL_TEXTURE:
			image = &builder.makeConfig<Texture2D>();
			break;
		default:
			DE_FATAL("Impossible case");
	}
	image->internalFormat = format;
	image->width = width;
	image->height = height;
	return image;
}